

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  uint *puVar1;
  curl_socket_t sockfd;
  imapstate iVar2;
  curl_usessl cVar3;
  Curl_easy *pCVar4;
  void *pvVar5;
  uint uVar6;
  _Bool _Var7;
  CURLcode CVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong maxlen;
  char *pcVar12;
  Curl_easy *pCVar13;
  long lVar14;
  byte *ptr;
  byte *pbVar15;
  bool bVar16;
  smtp_conn *smtpc;
  int smtpcode;
  size_t nread;
  saslprogress local_58;
  undefined4 uStack_54;
  uint local_4c;
  Curl_easy *local_48;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  pCVar4 = conn->data;
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE) {
    CVar8 = smtp_perform_upgrade_tls(conn);
    return CVar8;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar8;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.state;
  do {
    CVar8 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_4c,&local_38);
    uVar6 = local_4c;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar2 = (conn->proto).imapc.state;
    if (local_4c != 1 && iVar2 != IMAP_APPEND_FINAL) {
      (pCVar4->info).httpcode = local_4c;
    }
    if (local_4c == 0) {
      return CURLE_OK;
    }
    switch(iVar2) {
    case IMAP_SERVERGREET:
      if (local_4c - 200 < 100) {
        CVar8 = smtp_perform_ehlo(conn);
      }
      else {
        Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)local_4c);
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      break;
    case IMAP_CAPABILITY:
      pCVar13 = conn->data;
      if (local_4c - 300 < 0xffffff9c && local_4c != 1) {
        if ((CURLUSESSL_TRY < (pCVar13->set).use_ssl) && (conn->ssl[0].use != true))
        goto LAB_00135d3b;
        (conn->proto).ftpc.cwdcount = 0;
        CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
        if (CVar8 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_STARTTLS;
        }
      }
      else {
        pcVar12 = (pCVar13->state).buffer;
        local_48 = pCVar13;
        sVar10 = strlen(pcVar12);
        uVar11 = sVar10 - 4;
        if ((uVar11 < 8) || (*(long *)(pcVar12 + 4) != 0x534c545452415453)) {
          if ((uVar11 < 4) || (*(int *)(pcVar12 + 4) != 0x455a4953)) {
            if ((4 < uVar11) && (pcVar12[8] == ' ' && *(int *)(pcVar12 + 4) == 0x48545541)) {
              (conn->proto).imapc.resptag[2] = '\x01';
              lVar14 = sVar10 - 9;
              ptr = (byte *)(pcVar12 + 9);
LAB_00135dfc:
              bVar16 = lVar14 == 0;
              pbVar15 = ptr;
              if (!bVar16) {
                pbVar15 = ptr + lVar14;
                lVar14 = -lVar14;
                bVar16 = false;
                do {
                  if ((0x20 < (ulong)*ptr) || ((0x100002600U >> ((ulong)*ptr & 0x3f) & 1) == 0)) {
                    uVar11 = 0;
                    goto LAB_00135e4f;
                  }
                  ptr = ptr + 1;
                  lVar14 = lVar14 + 1;
                  bVar16 = lVar14 == 0;
                } while (!bVar16);
              }
              lVar14 = 0;
              goto LAB_00135e3c;
            }
          }
          else {
            (conn->proto).imapc.resptag[1] = '\x01';
          }
        }
        else {
          (conn->proto).imapc.resptag[0] = '\x01';
        }
LAB_00135ff1:
        CVar8 = CURLE_OK;
        if (uVar6 != 1) {
          cVar3 = (local_48->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).imapc.resptag[0] == '\x01') {
              CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
              if (CVar8 == CURLE_OK) {
                (conn->proto).imapc.state = IMAP_UPGRADETLS;
              }
              break;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(local_48,"STARTTLS not supported.");
              goto LAB_00135ed0;
            }
          }
LAB_0013601c:
          CVar8 = smtp_perform_authentication(conn);
        }
      }
      break;
    case IMAP_STARTTLS:
      if (local_4c - 200 < 100) goto switchD_00135af0_caseD_5;
      pCVar13 = conn->data;
LAB_00135d3b:
      Curl_failf(pCVar13,"Remote access denied: %d",(ulong)local_4c);
      CVar8 = CURLE_REMOTE_ACCESS_DENIED;
      break;
    case IMAP_UPGRADETLS:
      if (local_4c == 0xdc) {
        CVar8 = smtp_perform_upgrade_tls(conn);
      }
      else {
        if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_0013601c;
        Curl_failf(conn->data,"STARTTLS denied, code %d",(ulong)local_4c);
LAB_00135ed0:
        CVar8 = CURLE_USE_SSL_FAILED;
      }
      break;
    default:
switchD_00135af0_caseD_5:
      (conn->proto).imapc.state = IMAP_STOP;
      goto LAB_00135b2b;
    case IMAP_LOGIN:
      pCVar13 = conn->data;
      CVar8 = Curl_sasl_continue(local_40,conn,local_4c,&local_58);
      if (CVar8 == CURLE_OK) {
        if (local_58 == SASL_IDLE) {
          Curl_failf(pCVar13,"Authentication cancelled");
          CVar8 = CURLE_LOGIN_DENIED;
        }
        else {
          CVar8 = CURLE_OK;
          if (local_58 == SASL_DONE) {
            (conn->proto).imapc.state = IMAP_STOP;
          }
        }
      }
      break;
    case IMAP_LIST:
      pCVar13 = conn->data;
      pvVar5 = (pCVar13->req).protop;
      pcVar12 = (pCVar13->state).buffer;
      sVar10 = strlen(pcVar12);
      if (((((uVar6 - 300 < 0xffffff9c) && (*(long *)((long)pvVar5 + 0x10) != 0)) &&
           (uVar6 != 0x229)) && (uVar6 != 1)) ||
         (((uVar6 - 300 < 0xffffff9c && (uVar6 != 1)) && (*(long *)((long)pvVar5 + 0x10) == 0)))) {
        Curl_failf(pCVar13,"Command failed: %d",(ulong)uVar6);
        CVar8 = CURLE_RECV_ERROR;
      }
      else {
        CVar8 = CURLE_OK;
        if ((pCVar13->set).opt_no_body == false) {
          pcVar12[sVar10] = '\n';
          CVar8 = Curl_client_write(conn,1,pcVar12,sVar10 + 1);
          pcVar12[sVar10] = '\0';
        }
        if (uVar6 != 1) {
          if ((*(long *)((long)pvVar5 + 0x10) == 0) ||
             (lVar14 = *(long *)(*(long *)((long)pvVar5 + 0x10) + 8),
             *(long *)((long)pvVar5 + 0x10) = lVar14, lVar14 == 0)) {
            (conn->proto).imapc.state = IMAP_STOP;
          }
          else {
            CVar8 = smtp_perform_command(conn);
          }
        }
      }
      break;
    case IMAP_SELECT:
      if (local_4c - 200 < 100) {
LAB_00135c7a:
        CVar8 = smtp_perform_rcpt_to(conn);
      }
      else {
        pCVar13 = conn->data;
        pcVar12 = "MAIL failed: %d";
LAB_00135ee2:
        Curl_failf(pCVar13,pcVar12,(ulong)local_4c);
        CVar8 = CURLE_SEND_ERROR;
      }
      break;
    case IMAP_FETCH:
      pCVar13 = conn->data;
      if (99 < local_4c - 200) {
        pcVar12 = "RCPT failed: %d";
        goto LAB_00135ee2;
      }
      pvVar5 = (pCVar13->req).protop;
      lVar14 = *(long *)(*(long *)((long)pvVar5 + 0x10) + 8);
      *(long *)((long)pvVar5 + 0x10) = lVar14;
      if (lVar14 != 0) goto LAB_00135c7a;
      CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
      if (CVar8 != CURLE_OK) break;
      (conn->proto).imapc.state = IMAP_FETCH_FINAL;
LAB_00135b2b:
      CVar8 = CURLE_OK;
      break;
    case IMAP_FETCH_FINAL:
      pCVar13 = conn->data;
      if (local_4c != 0x162) {
        pcVar12 = "DATA failed: %d";
        goto LAB_00135ee2;
      }
      Curl_pgrsSetUploadSize(pCVar13,(pCVar13->state).infilesize);
      CVar8 = CURLE_OK;
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
      goto LAB_00135d29;
    case IMAP_APPEND:
      CVar8 = CURLE_RECV_ERROR;
      if (local_4c == 0xfa) {
        CVar8 = CURLE_OK;
      }
LAB_00135d29:
      (conn->proto).imapc.state = IMAP_STOP;
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
  while (uVar11 = uVar11 + 1, maxlen = -lVar14, uVar11 < (ulong)-lVar14) {
LAB_00135e4f:
    if (((ulong)ptr[uVar11] < 0x21) &&
       (maxlen = uVar11, (0x100002600U >> ((ulong)ptr[uVar11] & 0x3f) & 1) != 0)) break;
  }
  uVar9 = Curl_sasl_decode_mech((char *)ptr,maxlen,(size_t *)&local_58);
  if ((uVar9 != 0) && (CONCAT44(uStack_54,local_58) == maxlen)) {
    puVar1 = (uint *)((long)&conn->proto + 0x8c);
    *puVar1 = *puVar1 | uVar9;
  }
  pbVar15 = ptr + maxlen;
  lVar14 = -(lVar14 + maxlen);
LAB_00135e3c:
  ptr = pbVar15;
  if (bVar16) goto LAB_00135ff1;
  goto LAB_00135dfc;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}